

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufferShrink(xmlBufferPtr buf,uint len)

{
  uint uVar1;
  uint uVar2;
  xmlChar *__src;
  
  uVar1 = 0xffffffff;
  if (buf != (xmlBufferPtr)0x0) {
    if (len == 0) {
      uVar1 = 0;
    }
    else {
      uVar2 = buf->use - len;
      uVar1 = 0xffffffff;
      if (len <= buf->use) {
        buf->use = uVar2;
        __src = buf->content + len;
        uVar1 = len;
        if (buf->alloc == XML_BUFFER_ALLOC_IO) {
          buf->content = __src;
          buf->size = buf->size - len;
        }
        else {
          memmove(buf->content,__src,(ulong)(uVar2 + 1));
        }
      }
    }
  }
  return uVar1;
}

Assistant:

int
xmlBufferShrink(xmlBufferPtr buf, unsigned int len) {
    if (buf == NULL)
        return(-1);
    if (len == 0)
        return(0);
    if (len > buf->use)
        return(-1);

    buf->use -= len;

    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
        buf->content += len;
	buf->size -= len;
    } else {
	memmove(buf->content, &buf->content[len], buf->use + 1);
    }

    return(len);
}